

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

QString * __thiscall QFileSystemModel::filePath(QFileSystemModel *this,QModelIndex *index)

{
  long lVar1;
  undefined1 *puVar2;
  bool bVar3;
  QFileSystemModelPrivate *other;
  QFileSystemNode *pQVar4;
  pointer this_00;
  ulong uVar5;
  QModelIndex *in_RDX;
  QFileSystemModelPrivate *in_RSI;
  QFileSystemModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileSystemNode *canonicalNode;
  QFileSystemNode *dirNode;
  QFileSystemModelPrivate *d;
  QFileInfo resolvedInfo;
  QString canonicalPath;
  QFileInfo fullPathInfo;
  QString fullPath;
  QFileSystemModelPrivate *in_stack_ffffffffffffff38;
  QFileSystemNode *in_stack_ffffffffffffff40;
  QFileSystemModelPrivate *this_01;
  QFileInfo local_70 [8];
  undefined1 *local_68 [4];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QFileInfo local_30 [8];
  undefined1 *local_28;
  undefined1 local_20 [7];
  QString *path;
  QFileSystemModelPrivate *this_02;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  other = d_func((QFileSystemModel *)0xaa44b2);
  _local_20 = &DAT_aaaaaaaaaaaaaaaa;
  path = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  this_02 = (QFileSystemModelPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModelPrivate::filePath(in_RSI,in_RDX);
  pQVar4 = QFileSystemModelPrivate::node(this_01,(QModelIndex *)in_stack_ffffffffffffff40);
  bVar3 = QFileSystemModelPrivate::QFileSystemNode::isSymLink
                    (in_stack_ffffffffffffff40,SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
  if (bVar3) {
    this_00 = std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::
              operator->((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)
                         0xaa4535);
    bVar3 = QFileInfoGatherer::resolveSymlinks((QFileInfoGatherer *)this_00);
    if (((bVar3) &&
        (bVar3 = QHash<QString,_QString>::contains
                           ((QHash<QString,_QString> *)this_01,&in_stack_ffffffffffffff40->fileName)
        , bVar3)) &&
       (bVar3 = QFileSystemModelPrivate::QFileSystemNode::isDir
                          ((QFileSystemNode *)in_stack_ffffffffffffff38), bVar3)) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemModelPrivate::QFileSystemNode::fileInfo((QFileSystemNode *)this_01);
      bVar3 = QFileSystemModelPrivate::QFileSystemNode::hasInformation(pQVar4);
      if (!bVar3) {
        QFileInfo::QFileInfo(local_30,(QString *)local_20);
        QFileInfo::operator=
                  ((QFileInfo *)in_stack_ffffffffffffff40,(QFileInfo *)in_stack_ffffffffffffff38);
        QFileInfo::~QFileInfo(local_30);
      }
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      QFileInfo::canonicalFilePath();
      QFileInfo::canonicalFilePath();
      puVar2 = _local_20;
      uVar5 = (ulong)_local_20 >> 0x38;
      bVar3 = SUB81(uVar5,0);
      _local_20 = puVar2;
      pQVar4 = QFileSystemModelPrivate::node(this_02,path,bVar3);
      QString::~QString((QString *)0xaa465d);
      local_68[0] = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff40 = pQVar4;
      QFileSystemModelPrivate::QFileSystemNode::fileInfo((QFileSystemNode *)this_01);
      bVar3 = QFileSystemModelPrivate::QFileSystemNode::hasInformation(pQVar4);
      in_stack_ffffffffffffff38 = other;
      if (!bVar3) {
        QFileInfo::QFileInfo(local_70,(QString *)&local_48);
        QFileInfo::operator=((QFileInfo *)in_stack_ffffffffffffff40,(QFileInfo *)other);
        QFileInfo::~QFileInfo(local_70);
        in_stack_ffffffffffffff38 = other;
      }
      uVar5 = QFileInfo::exists();
      bVar3 = (uVar5 & 1) != 0;
      if (bVar3) {
        QFileInfo::filePath();
      }
      QFileInfo::~QFileInfo((QFileInfo *)local_68);
      QString::~QString((QString *)0xaa4703);
      QFileInfo::~QFileInfo((QFileInfo *)&local_28);
      if (bVar3) goto LAB_00aa4736;
    }
  }
  QString::QString(&in_stack_ffffffffffffff40->fileName,(QString *)in_stack_ffffffffffffff38);
LAB_00aa4736:
  QString::~QString((QString *)0xaa4743);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString QFileSystemModel::filePath(const QModelIndex &index) const
{
    Q_D(const QFileSystemModel);
    QString fullPath = d->filePath(index);
    QFileSystemModelPrivate::QFileSystemNode *dirNode = d->node(index);
    if (dirNode->isSymLink()
#if QT_CONFIG(filesystemwatcher)
        && d->fileInfoGatherer->resolveSymlinks()
#endif
        && d->resolvedSymLinks.contains(fullPath)
        && dirNode->isDir()) {
        QFileInfo fullPathInfo(dirNode->fileInfo());
        if (!dirNode->hasInformation())
            fullPathInfo = QFileInfo(fullPath);
        QString canonicalPath = fullPathInfo.canonicalFilePath();
        auto *canonicalNode = d->node(fullPathInfo.canonicalFilePath(), false);
        QFileInfo resolvedInfo = canonicalNode->fileInfo();
        if (!canonicalNode->hasInformation())
            resolvedInfo = QFileInfo(canonicalPath);
        if (resolvedInfo.exists())
            return resolvedInfo.filePath();
    }
    return fullPath;
}